

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

void ot::commissioner::CborValue::Move(CborValue *dst,CborValue *src)

{
  CborValue *src_local;
  CborValue *dst_local;
  
  Free(dst);
  operator=(dst,src);
  src->mIsRoot = true;
  src->mCbor = (cn_cbor *)0x0;
  return;
}

Assistant:

void CborValue::Move(CborValue &dst, CborValue &src)
{
    dst.Free();
    dst = src;

    src.mIsRoot = true;
    src.mCbor   = nullptr;
}